

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::SubqueryExpression::Deserialize(SubqueryExpression *this,Deserializer *deserializer)

{
  SubqueryType SVar1;
  ExpressionType EVar2;
  int iVar3;
  SubqueryExpression *this_00;
  pointer pSVar4;
  byte bVar5;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var9;
  string str;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_50;
  undefined1 local_48 [32];
  
  this_00 = (SubqueryExpression *)operator_new(0x58);
  SubqueryExpression(this_00);
  local_50._M_head_impl = this_00;
  pSVar4 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_50);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"subquery_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    SVar1 = EnumUtil::FromString<duckdb::SubqueryType>((char *)local_48._0_8_);
    if ((SelectStatement *)local_48._0_8_ != (SelectStatement *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    SVar1 = (SubqueryType)iVar3;
  }
  pSVar4->subquery_type = SVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pSVar4 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_50);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"subquery");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pSVar4->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar4->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
    if (_Var6._M_head_impl != (SelectStatement *)0x0) goto LAB_010a201c;
    bVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var8._M_head_impl = (SelectStatement *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      SelectStatement::Deserialize((SelectStatement *)local_48,deserializer);
      _Var8._M_head_impl = (SelectStatement *)local_48._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pSVar4->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar4->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var6._M_head_impl == (SelectStatement *)0x0) {
      bVar5 = 1;
    }
    else {
LAB_010a201c:
      (*((_Var6._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pSVar4 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_50);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"child");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var7._M_head_impl =
         (pSVar4->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar4->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var7._M_head_impl == (ParsedExpression *)0x0) {
      bVar5 = 0;
      goto LAB_010a20c8;
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var9._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_48,deserializer);
      _Var9._M_head_impl = (ParsedExpression *)local_48._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var7._M_head_impl =
         (pSVar4->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar4->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var9._M_head_impl;
    if (_Var7._M_head_impl == (ParsedExpression *)0x0) {
      bVar5 = 1;
      goto LAB_010a20c8;
    }
  }
  (*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010a20c8:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pSVar4 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_50);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"comparison_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    EVar2 = EnumUtil::FromString<duckdb::ExpressionType>((char *)local_48._0_8_);
    if ((SelectStatement *)local_48._0_8_ != (SelectStatement *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    EVar2 = (ExpressionType)iVar3;
  }
  pSVar4->comparison_type = EVar2;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_50._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> SubqueryExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SubqueryExpression>(new SubqueryExpression());
	deserializer.ReadProperty<SubqueryType>(200, "subquery_type", result->subquery_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<SelectStatement>>(201, "subquery", result->subquery);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "child", result->child);
	deserializer.ReadProperty<ExpressionType>(203, "comparison_type", result->comparison_type);
	return std::move(result);
}